

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O2

int16_t ** __thiscall webrtc::AudioBuffer::split_channels(AudioBuffer *this,Band band)

{
  IFChannelBuffer *this_00;
  ChannelBuffer<short> *t;
  ChannelBuffer<short> *pCVar1;
  short **ppsVar2;
  
  this->mixed_low_pass_valid_ = false;
  this_00 = (this->split_data_)._M_t.
            super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
            ._M_t.
            super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
            .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl;
  if (this_00 != (IFChannelBuffer *)0x0) {
    pCVar1 = IFChannelBuffer::ibuf(this_00);
    ppsVar2 = ChannelBuffer<short>::channels(pCVar1,(ulong)band);
    return ppsVar2;
  }
  if (band != kBand0To8kHz) {
    return (int16_t **)0x0;
  }
  pCVar1 = IFChannelBuffer::ibuf
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<webrtc::IFChannelBuffer,_std::default_delete<webrtc::IFChannelBuffer>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_webrtc::IFChannelBuffer_*,_std::default_delete<webrtc::IFChannelBuffer>_>
                      .super__Head_base<0UL,_webrtc::IFChannelBuffer_*,_false>._M_head_impl);
  ppsVar2 = ChannelBuffer<short>::channels(pCVar1);
  return ppsVar2;
}

Assistant:

int16_t* const* AudioBuffer::split_channels(Band band) {
  mixed_low_pass_valid_ = false;
  if (split_data_.get()) {
    return split_data_->ibuf()->channels(band);
  } else {
    return band == kBand0To8kHz ? data_->ibuf()->channels() : nullptr;
  }
}